

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

string * random_id_abi_cxx11_(string *__return_storage_ptr__,int len)

{
  uint uVar1;
  result_type rVar2;
  char *__s;
  size_t sVar3;
  int iVar4;
  size_t __i;
  long lVar5;
  ulong uVar6;
  string *retval;
  uniform_int_distribution<int> dis;
  mt19937 gen;
  random_device rd;
  param_type local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar1;
  lVar5 = 1;
  uVar6 = local_2740._M_x[0];
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar5);
    local_2740._M_x[lVar5] = uVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_2740._M_p = 0x270;
  local_2748._M_a = 0;
  local_2748._M_b = 0x3d;
  iVar4 = -1;
  if (-2 < len) {
    iVar4 = len + 1;
  }
  __s = (char *)operator_new__((long)iVar4);
  if (0 < len) {
    uVar6 = 0;
    do {
      rVar2 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_2748,&local_2740,&local_2748);
      __s[uVar6] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar2];
      uVar6 = uVar6 + 1;
    } while ((uint)len != uVar6);
  }
  __s[len] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar3);
  operator_delete__(__s);
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

string random_id(const int len) {
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, alphanumlen - 1);

    auto *s = new char[len + 1];
    int rand_idx;
    for (int i = 0; i < len; ++i) {
        rand_idx = dis(gen);
        s[i] = alphanum[rand_idx];
    }
    s[len] = 0;
    string retval(s);
    delete [] s;
    return retval;
}